

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::operator!=(MP<6UL,_GF2::MOGrevlex<6UL>_> *this,bool cRight)

{
  bool bVar1;
  size_t sVar2;
  WW<6UL> *this_00;
  byte in_SIL;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar3;
  
  if ((in_SIL & 1) == 0) {
    sVar2 = Size((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c6997);
    bVar3 = sVar2 != 0;
  }
  else {
    sVar2 = Size((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c694d);
    bVar3 = 1;
    if (sVar2 == 1) {
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
                 CONCAT17(1,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
      this_00 = &std::_List_const_iterator<GF2::MM<6UL>_>::operator->
                           ((_List_const_iterator<GF2::MM<6UL>_> *)0x1c6975)->super_WW<6UL>;
      bVar1 = WW<6UL>::IsAllZero(this_00);
      bVar3 = bVar1 ^ 0xff;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool operator!=(bool cRight) const
	{	
		return cRight ? Size() != 1 || !begin()->IsAllZero() : Size() != 0;
	}